

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::AttachToGraph
               (aiNode *attach,
               vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               *srcList)

{
  undefined1 auVar1 [16];
  bool bVar2;
  reference pNVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  NodeAttachmentInfo *att;
  aiNode **ppaStack_38;
  uint i;
  aiNode **n;
  __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
  local_28;
  iterator it;
  uint cnt;
  vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> *srcList_local;
  aiNode *attach_local;
  
  for (it._M_current._4_4_ = 0; it._M_current._4_4_ < attach->mNumChildren;
      it._M_current._4_4_ = it._M_current._4_4_ + 1) {
    AttachToGraph(attach->mChildren[it._M_current._4_4_],srcList);
  }
  it._M_current._4_4_ = 0;
  local_28._M_current =
       (NodeAttachmentInfo *)
       std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::begin
                 (srcList);
  while( true ) {
    n = (aiNode **)
        std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::end
                  (srcList);
    bVar2 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
                        *)&n);
    if (!bVar2) break;
    pNVar3 = __gnu_cxx::
             __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
             ::operator*(&local_28);
    if ((pNVar3->attachToNode == attach) &&
       (pNVar3 = __gnu_cxx::
                 __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
                 ::operator*(&local_28), (pNVar3->resolved & 1U) == 0)) {
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
    ::operator++(&local_28);
  }
  if (it._M_current._4_4_ != 0) {
    auVar1 = ZEXT416(it._M_current._4_4_ + attach->mNumChildren) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaStack_38 = (aiNode **)operator_new__(uVar4);
    if (attach->mNumChildren != 0) {
      memcpy(ppaStack_38,attach->mChildren,(ulong)attach->mNumChildren << 3);
      if (attach->mChildren != (aiNode **)0x0) {
        operator_delete__(attach->mChildren);
      }
    }
    attach->mChildren = ppaStack_38;
    ppaStack_38 = ppaStack_38 + attach->mNumChildren;
    attach->mNumChildren = it._M_current._4_4_ + attach->mNumChildren;
    for (att._4_4_ = 0;
        sVar5 = std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                ::size(srcList), att._4_4_ < sVar5; att._4_4_ = att._4_4_ + 1) {
      pvVar6 = std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               ::operator[](srcList,(ulong)att._4_4_);
      if ((pvVar6->attachToNode == attach) && ((pvVar6->resolved & 1U) == 0)) {
        *ppaStack_38 = pvVar6->node;
        (*ppaStack_38)->mParent = attach;
        ppaStack_38 = ppaStack_38 + 1;
        pvVar6->resolved = true;
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::AttachToGraph (aiNode* attach, std::vector<NodeAttachmentInfo>& srcList) {
    unsigned int cnt;
    for ( cnt = 0; cnt < attach->mNumChildren; ++cnt ) {
        AttachToGraph( attach->mChildren[ cnt ], srcList );
    }

    cnt = 0;
    for (std::vector<NodeAttachmentInfo>::iterator it = srcList.begin();
         it != srcList.end(); ++it)
    {
        if ((*it).attachToNode == attach && !(*it).resolved)
            ++cnt;
    }

    if (cnt)    {
        aiNode** n = new aiNode*[cnt+attach->mNumChildren];
        if (attach->mNumChildren)   {
            ::memcpy(n,attach->mChildren,sizeof(void*)*attach->mNumChildren);
            delete[] attach->mChildren;
        }
        attach->mChildren = n;

        n += attach->mNumChildren;
        attach->mNumChildren += cnt;

        for (unsigned int i = 0; i < srcList.size();++i)    {
            NodeAttachmentInfo& att = srcList[i];
            if (att.attachToNode == attach && !att.resolved)    {
                *n = att.node;
                (**n).mParent = attach;
                ++n;

                // mark this attachment as resolved
                att.resolved = true;
            }
        }
    }
}